

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

char * testing::internal::GetAnsiColorCode(GTestColor color)

{
  char *pcStack_10;
  GTestColor color_local;
  
  if (color == COLOR_RED) {
    pcStack_10 = "1";
  }
  else if (color == COLOR_GREEN) {
    pcStack_10 = "2";
  }
  else if (color == COLOR_YELLOW) {
    pcStack_10 = "3";
  }
  else {
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char* GetAnsiColorCode(GTestColor color) {
  switch (color) {
    case COLOR_RED:     return "1";
    case COLOR_GREEN:   return "2";
    case COLOR_YELLOW:  return "3";
    default:            return NULL;
  };
}